

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void __thiscall dlib::error::error(error *this,string *a)

{
  string *in_RSI;
  exception *in_RDI;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__error_0038d048;
  std::__cxx11::string::string((string *)(in_RDI + 8),in_RSI);
  *(undefined4 *)(in_RDI + 0x28) = 9;
  return;
}

Assistant:

error(
            const std::string& a
        ): info(a), type(EUNSPECIFIED) {}